

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O1

void __thiscall Potassco::SmodelsOutput::output(SmodelsOutput *this,StringSpan *str,LitSpan *cond)

{
  ostream *poVar1;
  char *exp;
  uint line;
  char *fmt;
  
  if (this->sec_ < 2) {
    if ((cond->size == 1) && (0 < *cond->first)) {
      if (this->sec_ == 0) {
        std::ostream::operator<<((ostream *)this->os_,0);
        std::__ostream_insert<char,std::char_traits<char>>(this->os_,"\n",1);
        this->sec_ = 1;
      }
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)this->os_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      std::ostream::write((char *)this->os_,(long)str->first);
      std::__ostream_insert<char,std::char_traits<char>>(this->os_,"\n",1);
      return;
    }
    exp = "size(cond) == 1 && lit(*begin(cond)) > 0";
    fmt = "general output directive not supported in smodels format";
    line = 0x154;
  }
  else {
    exp = "sec_ <= 1";
    fmt = "adding symbols after compute not supported";
    line = 0x153;
  }
  fail(-2,"virtual void Potassco::SmodelsOutput::output(const StringSpan &, const LitSpan &)",line,
       exp,fmt,0);
}

Assistant:

void SmodelsOutput::output(const StringSpan& str, const LitSpan& cond) {
	POTASSCO_REQUIRE(sec_ <= 1, "adding symbols after compute not supported");
	POTASSCO_REQUIRE(size(cond) == 1 && lit(*begin(cond)) > 0, "general output directive not supported in smodels format");
	if (sec_ == 0) { startRule(End).endRule(); sec_ = 1; }
	os_ << unsigned(cond[0]) << " ";
	os_.write(begin(str), size(str));
	os_ << "\n";
}